

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5StorageInsertDocsize(Fts5Storage *p,i64 iRowid,Fts5Buffer *pBuf)

{
  sqlite3_mutex *psVar1;
  Vdbe *p_00;
  int iVar2;
  int iVar3;
  Vdbe *p_1;
  sqlite3_stmt *pReplace;
  Vdbe *local_28;
  
  if (p->pConfig->bColumnsize == 0) {
    iVar2 = 0;
  }
  else {
    local_28 = (Vdbe *)0x0;
    iVar2 = fts5StorageGetStmt(p,6,(sqlite3_stmt **)&local_28,(char **)0x0);
    p_00 = local_28;
    if (iVar2 == 0) {
      sqlite3_bind_int64((sqlite3_stmt *)local_28,1,iRowid);
      bindText((sqlite3_stmt *)p_00,2,pBuf->p,pBuf->n,(_func_void_void_ptr *)0x0,'\0');
      sqlite3_step((sqlite3_stmt *)p_00);
      iVar2 = sqlite3_reset((sqlite3_stmt *)p_00);
      iVar3 = vdbeUnbind(p_00,2);
      if ((iVar3 == 0) && (psVar1 = p_00->db->mutex, psVar1 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar1);
      }
    }
  }
  return iVar2;
}

Assistant:

static int fts5StorageInsertDocsize(
  Fts5Storage *p,                 /* Storage module to write to */
  i64 iRowid,                     /* id value */
  Fts5Buffer *pBuf                /* sz value */
){
  int rc = SQLITE_OK;
  if( p->pConfig->bColumnsize ){
    sqlite3_stmt *pReplace = 0;
    rc = fts5StorageGetStmt(p, FTS5_STMT_REPLACE_DOCSIZE, &pReplace, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pReplace, 1, iRowid);
      sqlite3_bind_blob(pReplace, 2, pBuf->p, pBuf->n, SQLITE_STATIC);
      sqlite3_step(pReplace);
      rc = sqlite3_reset(pReplace);
      sqlite3_bind_null(pReplace, 2);
    }
  }
  return rc;
}